

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

ChStreamInAscii * __thiscall chrono::ChStreamInAscii::operator>>(ChStreamInAscii *this,string *str)

{
  int iVar1;
  bool bVar2;
  char loa [2];
  byte local_5a [42];
  
  local_5a[1] = 0;
  std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0xa085fa);
  bVar2 = false;
  while( true ) {
    do {
      (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,local_5a,1);
      iVar1 = (*(this->super_ChStreamIn)._vptr_ChStreamIn[2])(this);
      if ((char)iVar1 != '\0') {
        return this;
      }
      if ((0x20 < (ulong)local_5a[0]) || ((0x100000600U >> ((ulong)local_5a[0] & 0x3f) & 1) == 0)) {
        bVar2 = true;
      }
    } while (!bVar2);
    if ((local_5a[0] < 0x21) && ((0x100000601U >> ((ulong)(uint)local_5a[0] & 0x3f) & 1) != 0))
    break;
    std::__cxx11::string::append((char *)str);
  }
  return this;
}

Assistant:

ChStreamInAscii& ChStreamInAscii::operator>>(std::string& str) {
    // bool stop = 0; //unused
    int cnt = 0;
    char loa[2];
    loa[1] = 0;
    str = "";
    bool started = false;

    while (true) {
        try {
            Input(loa, 1);
        } catch (const std::exception&) {
            if (!(this->End_of_stream() && cnt > 0))
                throw(ChException("Cannot read from stream"));
        }

        if (this->End_of_stream())
            break;

        if (loa[0] != *"\n" && loa[0] != *" " && loa[0] != *"\t")
            started = true;

        if (started) {
            if (loa[0] == *"\n" || loa[0] == *" " || loa[0] == *"\t" || loa[0] == 0)
                break;
            str.append(loa);
        }

        cnt++;
    }

    return *this;
}